

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabel::paintEvent(QLabel *this,QPaintEvent *param_2)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  Int IVar4;
  int iVar5;
  ColorRole CVar6;
  LayoutDirection LVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  QLabelPrivate *pQVar11;
  QStyle *pQVar12;
  QStyleSheetStyle *pQVar13;
  ulong uVar14;
  QIcon *pQVar15;
  unsigned_long_long t;
  long in_RDI;
  long in_FS_OFFSET;
  double dVar16;
  Mode mode;
  qreal dpr;
  int yo;
  int xo;
  int rh;
  int rw;
  int flags;
  bool underline;
  QStyleSheetStyle *cssStyle;
  int align;
  QStyle *style;
  QLabelPrivate *d;
  QString key;
  QPixmap pix;
  QSize size;
  QRect br;
  QRectF lr;
  QRect cr;
  QPainter painter;
  QStyleOption opt_1;
  PaintContext context;
  QTextCharFormat fmt;
  QStyleOption opt;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_short>_>
  *in_stack_fffffffffffffb28;
  LayoutDirection in_stack_fffffffffffffb30;
  QFlag in_stack_fffffffffffffb34;
  int in_stack_fffffffffffffb38;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_fffffffffffffb3c;
  int in_stack_fffffffffffffb40;
  uint in_stack_fffffffffffffb44;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  QWidget *in_stack_fffffffffffffb58;
  QStyleSheetStyle *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  byte local_405;
  uint local_3d8;
  QSize local_3a0;
  QPixmap local_398 [26];
  HexString<unsigned_short> local_37e;
  HexString<unsigned_int> local_37c;
  HexString<unsigned_int> local_378;
  HexString<unsigned_char> local_371;
  HexString<unsigned_long_long> local_370;
  QLatin1StringView local_368;
  undefined1 *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  QSize local_328;
  undefined8 local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  QSize local_300;
  undefined1 local_2f8 [16];
  QRect local_2e8;
  QRectF local_2d8;
  undefined1 local_2b8 [32];
  QPointF local_298;
  undefined1 local_268 [16];
  QRectF local_258;
  QPixmap local_238 [24];
  QSize local_220;
  QPixmap local_218 [24];
  QPixmap local_200 [24];
  QPixmap local_1e8 [28];
  QFlag local_1cc [2];
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_1c4;
  undefined1 local_1c0 [16];
  undefined1 *local_1b0;
  undefined1 local_1a8 [240];
  undefined1 local_b8 [8];
  QPalette aQStack_b0 [4];
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 local_48 [40];
  undefined1 auStack_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar11 = d_func((QLabel *)0x5b1031);
  pQVar12 = QWidget::style((QWidget *)in_stack_fffffffffffffb28);
  local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_1b0,(QPaintDevice *)(in_RDI + 0x10));
  QFrame::drawFrame((QFrame *)CONCAT44(in_stack_fffffffffffffb3c.i,in_stack_fffffffffffffb38),
                    (QPainter *)CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30));
  local_1c0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_1c0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_1c0 = (undefined1  [16])
              QWidget::contentsRect
                        ((QWidget *)CONCAT44(in_stack_fffffffffffffb3c.i,in_stack_fffffffffffffb38))
  ;
  QRect::adjust((QRect *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                in_stack_fffffffffffffb3c.i,in_stack_fffffffffffffb38,in_stack_fffffffffffffb34.i,
                in_stack_fffffffffffffb30);
  if ((*(ushort *)&pQVar11->field_0x340 >> 4 & 1) == 0) {
    QWidget::layoutDirection((QWidget *)0x5b1153);
  }
  else {
    QLabelPrivate::textDirection
              ((QLabelPrivate *)CONCAT44(in_stack_fffffffffffffb3c.i,in_stack_fffffffffffffb38));
  }
  QFlag::QFlag(local_1cc,pQVar11->align);
  QFlags<Qt::AlignmentFlag>::QFlagsStorageHelper
            ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffb28,in_stack_fffffffffffffb34);
  local_1c4.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorage<Qt::AlignmentFlag>)
       QStyle::visualAlignment(in_stack_fffffffffffffb30,(Alignment)in_stack_fffffffffffffb3c.i);
  IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c4);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMovie> *)0x5b11d9);
  local_405 = 0;
  if (bVar1) {
    QPointer<QMovie>::operator->((QPointer<QMovie> *)0x5b1207);
    QMovie::currentPixmap();
    local_405 = QPixmap::isNull();
    local_405 = local_405 ^ 0xff;
    QPixmap::~QPixmap(local_1e8);
  }
  if ((local_405 & 1) == 0) {
    if ((*(ushort *)&pQVar11->field_0x340 >> 4 & 1) == 0) {
      bVar1 = std::optional::operator_cast_to_bool((optional<QPicture> *)0x5b1a24);
      if (bVar1) {
        local_2f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_2f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        std::optional<QPicture>::operator->((optional<QPicture> *)0x5b1a5f);
        local_2f8 = QPicture::boundingRect();
        iVar5 = QRect::width((QRect *)in_stack_fffffffffffffb28);
        iVar9 = QRect::height((QRect *)in_stack_fffffffffffffb28);
        if ((*(ushort *)&pQVar11->field_0x340 >> 1 & 1) == 0) {
          if ((IVar4 & 0x80) == 0) {
            if ((IVar4 & 0x40) != 0) {
              QRect::height((QRect *)in_stack_fffffffffffffb28);
            }
          }
          else {
            QRect::height((QRect *)in_stack_fffffffffffffb28);
          }
          if ((IVar4 & 2) == 0) {
            if ((IVar4 & 4) != 0) {
              QRect::width((QRect *)in_stack_fffffffffffffb28);
            }
          }
          else {
            QRect::width((QRect *)in_stack_fffffffffffffb28);
          }
          QRect::x((QRect *)0x5b1caf);
          QRect::x((QRect *)0x5b1cc7);
          QRect::y((QRect *)0x5b1ce0);
          QRect::y((QRect *)0x5b1cf8);
          std::optional<QPicture>::operator*((optional<QPicture> *)0x5b1d18);
          QPainter::drawPicture
                    ((QPainter *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     in_stack_fffffffffffffb3c.i,in_stack_fffffffffffffb38,
                     (QPicture *)CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30));
        }
        else {
          QPainter::save();
          QRect::x((QRect *)0x5b1adb);
          QRect::y((QRect *)0x5b1af2);
          QPainter::translate((QPainter *)
                              CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                              (qreal)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                              (qreal)CONCAT44(in_stack_fffffffffffffb3c.i,in_stack_fffffffffffffb38)
                             );
          iVar10 = QRect::width((QRect *)in_stack_fffffffffffffb28);
          dVar16 = (double)iVar10 / (double)iVar5;
          iVar5 = QRect::height((QRect *)in_stack_fffffffffffffb28);
          QPainter::scale(dVar16,(double)iVar5 / (double)iVar9);
          QRect::x((QRect *)0x5b1b6b);
          QRect::y((QRect *)0x5b1b82);
          std::optional<QPicture>::operator*((optional<QPicture> *)0x5b1ba0);
          QPainter::drawPicture
                    ((QPainter *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     in_stack_fffffffffffffb3c.i,in_stack_fffffffffffffb38,
                     (QPicture *)CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30));
          QPainter::restore();
        }
      }
      else {
        bVar1 = std::optional::operator_cast_to_bool((optional<QIcon> *)0x5b1d49);
        if (bVar1) {
          std::optional<QIcon>::operator->((optional<QIcon> *)0x5b1d66);
          uVar14 = QIcon::isNull();
          if ((uVar14 & 1) == 0) {
            dVar16 = (double)QPaintDevice::devicePixelRatio();
            local_300 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
            if ((*(ushort *)&pQVar11->field_0x340 >> 1 & 1) == 0) {
              local_300 = pQVar11->pixmapSize;
            }
            else {
              local_300 = QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffb44,
                                                        in_stack_fffffffffffffb40));
            }
            bVar1 = QWidget::isEnabled((QWidget *)0x5b1df8);
            local_318 = &DAT_aaaaaaaaaaaaaaaa;
            local_310 = &DAT_aaaaaaaaaaaaaaaa;
            local_308 = &DAT_aaaaaaaaaaaaaaaa;
            pQVar15 = std::optional<QIcon>::operator->((optional<QIcon> *)0x5b1e4f);
            QIcon::pixmap((QSize *)&local_318,dVar16,(Mode)pQVar15,(State)&local_300);
            in_stack_fffffffffffffb44 = in_stack_fffffffffffffb44 & 0xffffff;
            if ((*(ushort *)&pQVar11->field_0x340 >> 1 & 1) != 0) {
              local_320 = QPixmap::size();
              local_328 = ::operator*((QSize *)CONCAT44(in_stack_fffffffffffffb44,
                                                        in_stack_fffffffffffffb40),
                                      (qreal)CONCAT44(in_stack_fffffffffffffb3c.i,
                                                      in_stack_fffffffffffffb38));
              bVar3 = ::operator!=((QSize *)CONCAT44(in_stack_fffffffffffffb34.i,
                                                     in_stack_fffffffffffffb30),
                                   (QSize *)in_stack_fffffffffffffb28);
              in_stack_fffffffffffffb44 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffb44);
            }
            if ((char)(in_stack_fffffffffffffb44 >> 0x18) != '\0') {
              local_340 = &DAT_aaaaaaaaaaaaaaaa;
              local_338 = &DAT_aaaaaaaaaaaaaaaa;
              local_330 = &DAT_aaaaaaaaaaaaaaaa;
              local_368 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)CONCAT44(in_stack_fffffffffffffb3c.i,
                                                      in_stack_fffffffffffffb38),
                                     CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30)
                                    );
              t = QPixmap::cacheKey();
              HexString<unsigned_long_long>::HexString(&local_370,t);
              ::operator%((QLatin1String *)
                          CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30),
                          (HexString<unsigned_long_long> *)in_stack_fffffffffffffb28);
              HexString<unsigned_char>::HexString(&local_371,!bVar1);
              ::operator%((QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_> *)
                          CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30),
                          (HexString<unsigned_char> *)in_stack_fffffffffffffb28);
              uVar8 = QSize::width((QSize *)0x5b1fc3);
              HexString<unsigned_int>::HexString(&local_378,uVar8);
              ::operator%((QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>
                           *)CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30),
                          (HexString<unsigned_int> *)in_stack_fffffffffffffb28);
              uVar8 = QSize::height((QSize *)0x5b1ffc);
              HexString<unsigned_int>::HexString(&local_37c,uVar8);
              ::operator%((QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_int>_>
                           *)CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30),
                          (HexString<unsigned_int> *)in_stack_fffffffffffffb28);
              iVar5 = qRound(2.9505748589333e-317);
              HexString<unsigned_short>::HexString(&local_37e,(unsigned_short)iVar5);
              ::operator%((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>
                           *)CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30),
                          (HexString<unsigned_short> *)in_stack_fffffffffffffb28);
              ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffb28);
              uVar14 = QPixmapCache::find((QString *)&local_340,(QPixmap *)&local_318);
              if ((uVar14 & 1) == 0) {
                local_3a0 = ::operator*((QSize *)CONCAT44(in_stack_fffffffffffffb44,
                                                          in_stack_fffffffffffffb40),
                                        (qreal)CONCAT44(in_stack_fffffffffffffb3c.i,
                                                        in_stack_fffffffffffffb38));
                QPixmap::scaled((QSize *)local_398,(AspectRatioMode)&local_318,
                                (TransformationMode)&local_3a0);
                QPixmap::operator=((QPixmap *)
                                   CONCAT44(in_stack_fffffffffffffb3c.i,in_stack_fffffffffffffb38),
                                   (QPixmap *)
                                   CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30));
                QPixmap::~QPixmap(local_398);
                QPixmap::setDevicePixelRatio(dVar16);
                QPixmapCache::insert((QString *)&local_340,(QPixmap *)&local_318);
              }
              QString::~QString((QString *)0x5b213a);
            }
            memset(local_1a8,0xaa,0x40);
            QStyleOption::QStyleOption
                      ((QStyleOption *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48)
                       ,in_stack_fffffffffffffb44,in_stack_fffffffffffffb40);
            QStyleOption::initFrom
                      ((QStyleOption *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48)
                       ,(QWidget *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
            (**(code **)(*(long *)pQVar12 + 0xa0))(pQVar12,&local_1b0,local_1c0,IVar4,&local_318);
            QStyleOption::~QStyleOption
                      ((QStyleOption *)
                       CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30));
            QPixmap::~QPixmap((QPixmap *)&local_318);
          }
        }
      }
    }
    else {
      local_258.xp = -NAN;
      local_258.yp = -NAN;
      local_258.w = -NAN;
      local_258.h = -NAN;
      QLabelPrivate::layoutRect
                ((QLabelPrivate *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      local_268 = QRectF::toAlignedRect();
      QRectF::QRectF((QRectF *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     (QRect *)CONCAT44(in_stack_fffffffffffffb3c.i,in_stack_fffffffffffffb38));
      memset(local_48,0xaa,0x40);
      QStyleOption::QStyleOption
                ((QStyleOption *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                 in_stack_fffffffffffffb44,in_stack_fffffffffffffb40);
      QStyleOption::initFrom
                ((QStyleOption *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                 (QWidget *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      pQVar13 = qt_styleSheet((QStyle *)0x5b14cb);
      if (pQVar13 != (QStyleSheetStyle *)0x0) {
        QStyleSheetStyle::styleSheetPalette
                  (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                   (QStyleOption *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                   (QPalette *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      }
      if (pQVar11->control == (QWidgetTextControl *)0x0) {
        LVar7 = QLabelPrivate::textDirection
                          ((QLabelPrivate *)
                           CONCAT44(in_stack_fffffffffffffb3c.i,in_stack_fffffffffffffb38));
        uVar8 = 0x40000;
        if (LVar7 == LeftToRight) {
          uVar8 = 0x20000;
        }
        uVar8 = IVar4 | uVar8;
        local_3d8 = uVar8;
        if ((*(ushort *)&pQVar11->field_0x340 >> 5 & 1) != 0) {
          local_3d8 = uVar8 | 0x800;
          iVar5 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,0x29,local_48,in_RDI,0);
          if (iVar5 == 0) {
            local_3d8 = uVar8 | 0x8800;
          }
        }
        local_2e8 = QRectF::toRect((QRectF *)in_stack_fffffffffffffb58);
        bVar1 = QWidget::isEnabled((QWidget *)0x5b1992);
        in_stack_fffffffffffffb30 =
             QWidget::foregroundRole
                       ((QWidget *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
        (**(code **)(*(long *)pQVar12 + 0x98))
                  (pQVar12,&local_1b0,&local_2e8,local_3d8,auStack_20,bVar1,&pQVar11->text);
      }
      else {
        iVar5 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,0x29,0,in_RDI);
        bVar1 = false;
        if (pQVar11->shortcutId != 0) {
          QTextCursor::charFormat();
          bVar2 = QTextCharFormat::fontUnderline();
          bVar1 = (iVar5 != 0) != (bool)(bVar2 & 1);
          QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x5b15fc);
        }
        if (bVar1) {
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          local_60 = &DAT_aaaaaaaaaaaaaaaa;
          QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_68);
          QTextCharFormat::setFontUnderline
                    ((QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffffb3c.i,in_stack_fffffffffffffb38),
                     SUB41((uint)in_stack_fffffffffffffb34.i >> 0x18,0));
          QTextCursor::mergeCharFormat((QTextCharFormat *)&pQVar11->shortcutCursor);
          QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x5b1676);
        }
        QLabelPrivate::ensureTextLayouted
                  ((QLabelPrivate *)CONCAT44(in_stack_fffffffffffffb3c.i,in_stack_fffffffffffffb38))
        ;
        memcpy(local_b8,&DAT_00b19930,0x50);
        QAbstractTextDocumentLayout::PaintContext::PaintContext
                  ((PaintContext *)CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30));
        QPalette::operator=(aQStack_b0,(QPalette *)auStack_20);
        CVar6 = QWidget::foregroundRole
                          ((QWidget *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48))
        ;
        if (CVar6 != Text) {
          bVar1 = QWidget::isEnabled((QWidget *)0x5b16e5);
          if (bVar1) {
            QWidget::foregroundRole
                      ((QWidget *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
            QPalette::color((QPalette *)
                            CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30),
                            (ColorRole)((ulong)in_stack_fffffffffffffb28 >> 0x20));
            QPalette::setColor((QPalette *)
                               CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30),
                               (ColorRole)((ulong)in_stack_fffffffffffffb28 >> 0x20),
                               (QColor *)0x5b1744);
          }
        }
        QPainter::save();
        local_298 = QRectF::topLeft((QRectF *)
                                    CONCAT44(in_stack_fffffffffffffb3c.i,in_stack_fffffffffffffb38))
        ;
        QPainter::translate((QPointF *)&local_1b0);
        QRectF::x(&local_258);
        QRectF::y(&local_258);
        QRectF::translated((QRectF *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                           (qreal)CONCAT44(in_stack_fffffffffffffb3c.i,in_stack_fffffffffffffb38),
                           (qreal)CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30));
        QPainter::setClipRect((QRectF *)&local_1b0,(ClipOperation)local_2b8);
        QWidgetTextControl::setPalette
                  ((QWidgetTextControl *)
                   CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30),
                   (QPalette *)in_stack_fffffffffffffb28);
        QRectF::QRectF(&local_2d8);
        QWidgetTextControl::drawContents
                  ((QWidgetTextControl *)in_stack_fffffffffffffb58,
                   (QPainter *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                   (QRectF *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                   (QWidget *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        QPainter::restore();
        QAbstractTextDocumentLayout::PaintContext::~PaintContext
                  ((PaintContext *)CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30));
      }
      QStyleOption::~QStyleOption
                ((QStyleOption *)CONCAT44(in_stack_fffffffffffffb34.i,in_stack_fffffffffffffb30));
    }
  }
  else if ((*(ushort *)&pQVar11->field_0x340 >> 1 & 1) == 0) {
    QPointer<QMovie>::operator->((QPointer<QMovie> *)0x5b1386);
    QMovie::currentPixmap();
    (**(code **)(*(long *)pQVar12 + 0xa0))(pQVar12,&local_1b0,local_1c0,IVar4,local_238);
    QPixmap::~QPixmap(local_238);
  }
  else {
    QPointer<QMovie>::operator->((QPointer<QMovie> *)0x5b12c0);
    QMovie::currentPixmap();
    local_220 = QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    QPixmap::scaled((QSize *)local_200,(AspectRatioMode)local_218,(TransformationMode)&local_220);
    (**(code **)(*(long *)pQVar12 + 0xa0))(pQVar12,&local_1b0,local_1c0,IVar4,local_200);
    QPixmap::~QPixmap(local_200);
    QPixmap::~QPixmap(local_218);
  }
  QPainter::~QPainter((QPainter *)&local_1b0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLabel::paintEvent(QPaintEvent *)
{
    Q_D(QLabel);
    QStyle *style = QWidget::style();
    QPainter painter(this);
    drawFrame(&painter);
    QRect cr = contentsRect();
    cr.adjust(d->margin, d->margin, -d->margin, -d->margin);
    int align = QStyle::visualAlignment(d->isTextLabel ? d->textDirection()
                                                       : layoutDirection(), QFlag(d->align));

#if QT_CONFIG(movie)
    if (d->movie && !d->movie->currentPixmap().isNull()) {
        if (d->scaledcontents)
            style->drawItemPixmap(&painter, cr, align, d->movie->currentPixmap().scaled(cr.size()));
        else
            style->drawItemPixmap(&painter, cr, align, d->movie->currentPixmap());
    }
    else
#endif
    if (d->isTextLabel) {
        QRectF lr = d->layoutRect().toAlignedRect();
        QStyleOption opt;
        opt.initFrom(this);
#ifndef QT_NO_STYLE_STYLESHEET
        if (QStyleSheetStyle* cssStyle = qt_styleSheet(style))
            cssStyle->styleSheetPalette(this, &opt, &opt.palette);
#endif
        if (d->control) {
#ifndef QT_NO_SHORTCUT
            const bool underline = static_cast<bool>(style->styleHint(QStyle::SH_UnderlineShortcut,
                                                                      nullptr, this, nullptr));
            if (d->shortcutId != 0
                && underline != d->shortcutCursor.charFormat().fontUnderline()) {
                QTextCharFormat fmt;
                fmt.setFontUnderline(underline);
                d->shortcutCursor.mergeCharFormat(fmt);
            }
#endif
            d->ensureTextLayouted();

            QAbstractTextDocumentLayout::PaintContext context;
            // Adjust the palette
            context.palette = opt.palette;

            if (foregroundRole() != QPalette::Text && isEnabled())
                context.palette.setColor(QPalette::Text, context.palette.color(foregroundRole()));

            painter.save();
            painter.translate(lr.topLeft());
            painter.setClipRect(lr.translated(-lr.x(), -lr.y()));
            d->control->setPalette(context.palette);
            d->control->drawContents(&painter, QRectF(), this);
            painter.restore();
        } else {
            int flags = align | (d->textDirection() == Qt::LeftToRight ? Qt::TextForceLeftToRight
                                                                       : Qt::TextForceRightToLeft);
            if (d->hasShortcut) {
                flags |= Qt::TextShowMnemonic;
                if (!style->styleHint(QStyle::SH_UnderlineShortcut, &opt, this))
                    flags |= Qt::TextHideMnemonic;
            }
            style->drawItemText(&painter, lr.toRect(), flags, opt.palette, isEnabled(), d->text, foregroundRole());
        }
    } else
#ifndef QT_NO_PICTURE
    if (d->picture) {
        QRect br = d->picture->boundingRect();
        int rw = br.width();
        int rh = br.height();
        if (d->scaledcontents) {
            painter.save();
            painter.translate(cr.x(), cr.y());
            painter.scale((double)cr.width()/rw, (double)cr.height()/rh);
            painter.drawPicture(-br.x(), -br.y(), *d->picture);
            painter.restore();
        } else {
            int xo = 0;
            int yo = 0;
            if (align & Qt::AlignVCenter)
                yo = (cr.height()-rh)/2;
            else if (align & Qt::AlignBottom)
                yo = cr.height()-rh;
            if (align & Qt::AlignRight)
                xo = cr.width()-rw;
            else if (align & Qt::AlignHCenter)
                xo = (cr.width()-rw)/2;
            painter.drawPicture(cr.x()+xo-br.x(), cr.y()+yo-br.y(), *d->picture);
        }
    } else
#endif
    if (d->icon && !d->icon->isNull()) {
        const qreal dpr = devicePixelRatio();
        const QSize size = d->scaledcontents ? cr.size() : d->pixmapSize;
        const auto mode = isEnabled() ? QIcon::Normal : QIcon::Disabled;
        QPixmap pix = d->icon->pixmap(size, dpr, mode);
        if (d->scaledcontents && pix.size() != size * dpr) {
            const QString key = "qt_label_"_L1 % HexString<quint64>(pix.cacheKey())
                                               % HexString<quint8>(mode)
                                               % HexString<uint>(size.width())
                                               % HexString<uint>(size.height())
                                               % HexString<quint16>(qRound(dpr * 1000));
            if (!QPixmapCache::find(key, &pix)) {
                pix = pix.scaled(size * dpr, Qt::IgnoreAspectRatio, Qt::SmoothTransformation);
                pix.setDevicePixelRatio(dpr);
                // using QIcon to cache the newly create pixmap is not possible
                // because QIcon does not clear this cache (so we grow indefinitely)
                // and also uses the newly added pixmap as starting point for new
                // scaled pixmap which makes it very blurry.
                // Therefore use QPixmapCache here.
                QPixmapCache::insert(key, pix);
            }
        }
        QStyleOption opt;
        opt.initFrom(this);
        style->drawItemPixmap(&painter, cr, align, pix);
    }
}